

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

XML_Bool startParsing(XML_Parser parser)

{
  XML_Bool XVar1;
  uint uVar2;
  int iVar3;
  __pid_t _Var4;
  int *piVar5;
  ssize_t sVar6;
  char *label;
  size_t bytesWrittenTotal;
  ulong uVar7;
  unsigned_long entropy;
  ulong local_40;
  timeval local_38;
  
  if (parser->m_hash_secret_salt == 0) {
    uVar7 = 0;
    do {
      uVar2 = getrandom((long)&local_40 + uVar7,8 - uVar7,1);
      if ((0 < (int)uVar2) && (uVar7 = uVar7 + (uVar2 & 0x7fffffff), 7 < uVar7)) {
        label = "getrandom";
        entropy = local_40;
        goto LAB_00341aa3;
      }
      piVar5 = __errno_location();
    } while (*piVar5 == 4);
    iVar3 = open("/dev/urandom",0);
    if (-1 < iVar3) {
      uVar7 = 0;
      do {
        sVar6 = read(iVar3,(void *)((long)&local_40 + uVar7),8 - uVar7);
        if (0 < sVar6 && 7 < sVar6 + uVar7) {
          close(iVar3);
          label = "/dev/urandom";
          entropy = local_40;
          goto LAB_00341aa3;
        }
        if (0 < sVar6) {
          uVar7 = sVar6 + uVar7;
        }
      } while (*piVar5 == 4);
      close(iVar3);
    }
    iVar3 = gettimeofday(&local_38,(__timezone_ptr_t)0x0);
    if (iVar3 != 0) {
      __assert_fail("gettimeofday_res == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmexpat/lib/xmlparse.c"
                    ,0x32d,"unsigned long gather_time_entropy(void)");
    }
    _Var4 = getpid();
    local_40 = _Var4 ^ local_38.tv_usec;
    label = "fallback(8)";
    entropy = local_40 * 0x1fffffffffffffff;
LAB_00341aa3:
    ENTROPY_DEBUG(label,entropy);
    parser->m_hash_secret_salt = entropy;
  }
  if (parser->m_ns == '\0') {
    XVar1 = '\x01';
  }
  else {
    XVar1 = setContext(parser,"xml=http://www.w3.org/XML/1998/namespace");
  }
  return XVar1;
}

Assistant:

static XML_Bool  /* only valid for root parser */
startParsing(XML_Parser parser)
{
    /* hash functions must be initialized before setContext() is called */
    if (parser->m_hash_secret_salt == 0)
      parser->m_hash_secret_salt = generate_hash_secret_salt(parser);
    if (parser->m_ns) {
      /* implicit context only set for root parser, since child
         parsers (i.e. external entity parsers) will inherit it
      */
      return setContext(parser, implicitContext);
    }
    return XML_TRUE;
}